

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.hh
# Opt level: O1

void __thiscall QPDFExc::QPDFExc(QPDFExc *this,QPDFExc *param_1)

{
  pointer pcVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,&param_1->super_runtime_error);
  *(undefined ***)this = &PTR__QPDFExc_002eedb8;
  this->error_code = param_1->error_code;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (param_1->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + (param_1->filename)._M_string_length);
  (this->object)._M_dataplus._M_p = (pointer)&(this->object).field_2;
  pcVar1 = (param_1->object)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->object,pcVar1,pcVar1 + (param_1->object)._M_string_length);
  this->offset = param_1->offset;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (param_1->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + (param_1->message)._M_string_length);
  return;
}

Assistant:

class QPDF_DLL_CLASS QPDFExc: public std::runtime_error
{
  public:
    QPDF_DLL
    QPDFExc(
        qpdf_error_code_e error_code,
        std::string const& filename,
        std::string const& object,
        qpdf_offset_t offset,
        std::string const& message);

    QPDF_DLL
    QPDFExc(
        qpdf_error_code_e error_code,
        std::string const& filename,
        std::string const& object,
        qpdf_offset_t offset,
        std::string const& message,
        bool zero_offset_valid);

    ~QPDFExc() noexcept override = default;

    // To get a complete error string, call what(), provided by std::exception.  The accessors below
    // return the original values used to create the exception.  Only the error code and message are
    // guaranteed to have non-zero/empty values.

    // There is no lookup code that maps numeric error codes into strings.  The numeric error code
    // is just another way to get at the underlying issue, but it is more programmer-friendly than
    // trying to parse a string that is subject to change.

    QPDF_DLL
    qpdf_error_code_e getErrorCode() const;
    QPDF_DLL
    std::string const& getFilename() const;
    QPDF_DLL
    std::string const& getObject() const;
    QPDF_DLL
    qpdf_offset_t getFilePosition() const;
    QPDF_DLL
    std::string const& getMessageDetail() const;

  private:
    QPDF_DLL_PRIVATE
    static std::string createWhat(
        std::string const& filename,
        std::string const& object,
        qpdf_offset_t offset,
        std::string const& message);

    // This class does not use the Members pattern to avoid needless memory allocations during
    // exception handling.

    qpdf_error_code_e error_code;
    std::string filename;
    std::string object;
    qpdf_offset_t offset;
    std::string message;
}